

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

int __thiscall libtorrent::bdecode_node::dict_size(bdecode_node *this)

{
  int local_28;
  int local_24;
  int ret;
  int token;
  bdecode_token *tokens;
  bdecode_node *this_local;
  
  if (this->m_size == -1) {
    local_24 = this->m_token_idx + 1;
    local_28 = 0;
    if (this->m_last_index != -1) {
      local_28 = this->m_last_index << 1;
      local_24 = this->m_last_token;
    }
    while (((uint)((ulong)this->m_root_tokens[local_24] >> 0x1d) & 7) != 5) {
      local_24 = (SUB84(this->m_root_tokens[local_24],4) & 0x1fffffff) + local_24;
      local_28 = local_28 + 1;
    }
    this_local._4_4_ = local_28 / 2;
    this->m_size = this_local._4_4_;
  }
  else {
    this_local._4_4_ = this->m_size;
  }
  return this_local._4_4_;
}

Assistant:

int bdecode_node::dict_size() const
	{
		TORRENT_ASSERT(type() == dict_t);
		TORRENT_ASSERT(m_token_idx != -1);

		if (m_size != -1) return m_size;

		bdecode_token const* tokens = m_root_tokens;
		TORRENT_ASSERT(tokens[m_token_idx].type == bdecode_token::dict);

		// this is the first item
		int token = m_token_idx + 1;
		int ret = 0;

		if (m_last_index != -1)
		{
			ret = m_last_index * 2;
			token = m_last_token;
		}

		while (tokens[token].type != bdecode_token::end)
		{
			token += tokens[token].next_item;
			++ret;
		}

		// a dictionary must contain full key-value pairs. which means
		// the number of entries is divisible by 2
		TORRENT_ASSERT((ret % 2) == 0);

		// each item is one key and one value, so divide by 2
		ret /= 2;

		m_size = ret;

		return ret;
	}